

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Allocate(BaseDictionary<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int **ppBuckets,EntryType **ppEntries,uint bucketCount,int size)

{
  Type this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  int *__s;
  size_t requestedBytes;
  EntryType *__s_00;
  
  __s_00 = (EntryType *)&DAT_00000008;
  __s = (int *)&DAT_00000008;
  if (bucketCount != 0) {
    __s = (int *)new__<Memory::JitArenaAllocator>((ulong)bucketCount * 4,this->alloc,0x3eba5c);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x46b,"(buckets)","buckets");
      if (!bVar2) goto LAB_0042fd3b;
      *puVar4 = 0;
      __s = (int *)0x0;
    }
  }
  if (size != 0) {
    this_00 = this->alloc;
    requestedBytes = 0xffffffffffffffff;
    if (-1 < size) {
      requestedBytes = (ulong)(uint)size << 4;
    }
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0042fd3b;
      *puVar4 = 0;
    }
    __s_00 = (EntryType *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,requestedBytes);
    memset(__s_00,0,requestedBytes);
    memset((char *)((long)&(__s_00->
                           super_DefaultHashedEntry<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           ).
                           super_KeyValueEntry<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*>
                           .
                           super_ValueEntry<JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*>_>
                           .
                           super_KeyValueEntryDataLayout2<int,_JsUtil::BaseHashSet<Js::JitIndexedPropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::JitIndexedPropertyGuard_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_*>
                           .value + requestedBytes),0,
           (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
    if (__s_00 == (EntryType *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (bVar2) {
        *puVar4 = 0;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x471,"(entries)","entries");
        if (bVar2) {
          *puVar4 = 0;
          __s_00 = (EntryType *)0x0;
          goto LAB_0042fd0d;
        }
      }
LAB_0042fd3b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
LAB_0042fd0d:
  memset(__s,0xff,(ulong)bucketCount << 2);
  *ppBuckets = __s;
  *ppEntries = __s_00;
  return;
}

Assistant:

void Allocate(__deref_out_ecount(bucketCount) int** ppBuckets, __deref_out_ecount(size) EntryType** ppEntries, DECLSPEC_GUARD_OVERFLOW uint bucketCount, DECLSPEC_GUARD_OVERFLOW int size)
        {
            int *const buckets = AllocateBuckets(bucketCount);
            Assert(buckets); // no-throw allocators are currently not supported

            EntryType *entries;
            try
            {
                entries = AllocateEntries(size);
                Assert(entries); // no-throw allocators are currently not supported
            }
            catch(...)
            {
                DeleteBuckets(buckets, bucketCount);
                throw;
            }

            memset(buckets, -1, bucketCount * sizeof(buckets[0]));

            *ppBuckets = buckets;
            *ppEntries = entries;
        }